

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_mon_command(command *cmd)

{
  uint32_t *puVar1;
  bitflag *flags;
  short sVar2;
  cmd_code cVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  monster_conflict *mon;
  monster_lore *lore;
  monster *pmVar9;
  loc grid;
  monster_conflict *t_mon;
  char *pcVar10;
  object *obj;
  char o_name [80];
  char m_name [80];
  object *local_e0;
  int local_d8 [20];
  char local_88 [88];
  
  mon = get_commanded_monster();
  if (mon == (monster_conflict *)0x0) {
    __assert_fail("mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                  ,0x723,"void do_cmd_mon_command(struct command *)");
  }
  lore = get_lore(mon->race);
  monster_desc(local_88,0x50,(monster *)mon,L'̄');
  cVar3 = cmd->code;
  if ((int)cVar3 < 0x1d) {
    if (cVar3 == CMD_WALK) {
      wVar7 = cmd_get_direction((command_conflict *)cmd,"direction",local_d8,false);
      if (wVar7 != L'\0') {
        return;
      }
      grid = (loc)loc_sum((loc_conflict)mon->grid,(loc_conflict)ddgrid[local_d8[0]]);
      _Var4 = flag_has_dbg(mon->race->flags,0xb,0x15,"mon->race->flags","RF_NEVER_MOVE");
      if (_Var4) {
        pcVar10 = "The monster can not move.";
        goto LAB_0012fdf3;
      }
      t_mon = (monster_conflict *)square_monster(cave,grid);
      if (t_mon == (monster_conflict *)0x0) {
        _Var4 = square_ispassable(cave,grid);
        if (!_Var4) {
          _Var4 = square_isperm(cave,grid);
          if (_Var4) goto LAB_0012fedc;
          _Var4 = monster_is_visible((monster *)mon);
          if (_Var4) {
            flags = lore->flags;
            flag_on_dbg(flags,0xb,0x2e,"lore->flags","RF_PASS_WALL");
            flag_on_dbg(flags,0xb,0x2f,"lore->flags","RF_KILL_WALL");
            flag_on_dbg(flags,0xb,0x30,"lore->flags","RF_SMASH_WALL");
          }
          _Var4 = flag_has_dbg(mon->race->flags,0xb,0x2e,"mon->race->flags","RF_PASS_WALL");
          if (!_Var4) {
            _Var4 = flag_has_dbg(mon->race->flags,0xb,0x2f,"mon->race->flags","RF_KILL_WALL");
            if (_Var4) {
              square_destroy_wall(cave,grid);
            }
            else {
              _Var4 = flag_has_dbg(mon->race->flags,0xb,0x30,"mon->race->flags","RF_SMASH_WALL");
              if (!_Var4) {
                _Var4 = square_iscloseddoor(cave,grid);
                if ((_Var4) || (_Var4 = square_issecretdoor(cave,grid), _Var4)) {
                  _Var4 = flag_has_dbg(mon->race->flags,0xb,0x2c,"mon->race->flags","RF_OPEN_DOOR");
                  _Var5 = flag_has_dbg(mon->race->flags,0xb,0x2d,"mon->race->flags","RF_BASH_DOOR");
                  _Var6 = monster_is_visible((monster *)mon);
                  if (_Var6) {
                    flag_on_dbg(lore->flags,0xb,0x2c,"lore->flags","RF_OPEN_DOOR");
                    flag_on_dbg(lore->flags,0xb,0x2d,"lore->flags","RF_BASH_DOOR");
                  }
                  if (_Var4 || _Var5) {
                    _Var4 = square_islockeddoor(cave,grid);
                    if (!_Var4) {
                      if (_Var5) {
                        square_smash_door(cave,grid);
                        msg("You hear a door burst open!");
                      }
                      else {
                        square_open_door(cave,grid);
                      }
                      goto LAB_0012fea6;
                    }
                    wVar7 = square_door_power((chunk *)cave,grid);
                    wVar8 = Rand_div((int)mon->hp / 10);
                    if (wVar7 < wVar8) {
                      pcVar10 = "%s fiddles with the lock.";
                      if (_Var5) {
                        pcVar10 = "%s slams against the door.";
                      }
                      msg(pcVar10,local_88);
                      square_set_door_lock((chunk *)cave,grid,wVar7 + L'\xffffffff');
                    }
                  }
                }
                goto LAB_0012fedc;
              }
              square_smash_wall(cave,grid);
            }
          }
        }
LAB_0012fea6:
        monster_swap(mon->grid,grid);
        puVar1 = &player->upkeep->update;
        *puVar1 = *puVar1 | 0x60;
      }
      else {
        _Var4 = monster_attack_monster(mon,t_mon);
        if (_Var4) goto LAB_0012fd4c;
LAB_0012fedc:
        msg("The way is blocked.");
      }
LAB_0012fd4c:
      player->upkeep->energy_use = (uint)z_info->move_energy;
      return;
    }
    if (cVar3 == CMD_DROP) {
      local_e0 = get_random_monster_object(mon);
      if (local_e0 != (object *)0x0) {
        local_e0->held_m_idx = 0;
        pile_excise(&mon->held_obj,local_e0);
        drop_near((chunk *)cave,&local_e0,L'\0',mon->grid,true,false);
        object_desc((char *)local_d8,0x50,local_e0,0x43,player);
        _Var4 = ignore_item_ok(player,local_e0);
        if (!_Var4) {
          msg("%s drops %s.",local_88,local_d8);
        }
      }
      goto LAB_0012fd4c;
    }
  }
  else {
    if (cVar3 == CMD_CAST) {
      local_e0 = (object *)((ulong)local_e0 & 0xffffffff00000000);
      sVar2 = player->timed[2];
      target_set_monster((monster *)0x0);
      get_aim_dir((int *)&local_e0);
      pmVar9 = target_get_monster();
      if (pmVar9 == (monster *)0x0) {
        pcVar10 = "No target monster selected!";
      }
      else {
        (mon->target).midx = pmVar9->midx;
        flag_copy((bitflag *)local_d8,mon->race->spell_flags,0xc);
        wVar7 = choose_attack_spell((bitflag *)local_d8,true,true);
        if (wVar7 != L'\0') {
          do_mon_spell(wVar7,mon,sVar2 == 0);
          if (sVar2 == 0) {
            flag_on_dbg(lore->spell_flags,0xc,wVar7,"lore->spell_flags","spell_index");
            _Var4 = mon_spell_is_innate(wVar7);
            if (_Var4) {
              if (lore->cast_innate != 0xff) {
                lore->cast_innate = lore->cast_innate + '\x01';
              }
            }
            else if (lore->cast_spell != 0xff) {
              lore->cast_spell = lore->cast_spell + '\x01';
            }
          }
          if ((player->is_dead == true) && (lore->deaths < 0x7fff)) {
            lore->deaths = lore->deaths + 1;
          }
          lore_update(mon->race,lore);
          goto LAB_0012fd4c;
        }
        pcVar10 = "This monster has no spells!";
      }
      goto LAB_0012fdf3;
    }
    if (cVar3 == CMD_HOLD) goto LAB_0012fd4c;
    if (cVar3 == CMD_READ_SCROLL) {
      mon_clear_timed((monster *)mon,L'\b',L'\x01');
      player_clear_timed(player,L',',true,false);
      goto LAB_0012fd4c;
    }
  }
  pcVar10 = "Valid commands: move, stand still, \'d\'rop, \'m\'agic, or \'r\'elease.";
LAB_0012fdf3:
  msg(pcVar10);
  return;
}

Assistant:

void do_cmd_mon_command(struct command *cmd)
{
	struct monster *mon = get_commanded_monster();
	struct monster_lore *lore = NULL;
	char m_name[80];

	assert(mon);
	lore = get_lore(mon->race);

	/* Get the monster name */
	monster_desc(m_name, sizeof(m_name), mon,
		MDESC_CAPITAL | MDESC_IND_HID | MDESC_COMMA);

	switch (cmd->code) {
		case CMD_READ_SCROLL: {
			/* Actually 'r'elease monster */
			mon_clear_timed(mon, MON_TMD_COMMAND, MON_TMD_FLG_NOTIFY);
			player_clear_timed(player, TMD_COMMAND, true, false);
			break;
		}
		case CMD_CAST: {
			int dir = DIR_UNKNOWN;
			struct monster *t_mon = NULL;
			bitflag f[RSF_SIZE];
			bool seen = player->timed[TMD_BLIND] ? false : true;
			int spell_index;

			/* Choose a target monster */
			target_set_monster(NULL);
			get_aim_dir(&dir);
			t_mon = target_get_monster();
			if (!t_mon) {
				msg("No target monster selected!");
				return;
			}
			mon->target.midx = t_mon->midx;

			/* Pick a random spell and cast it */
			rsf_copy(f, mon->race->spell_flags);
			spell_index = choose_attack_spell(f, true, true);
			if (!spell_index) {
				msg("This monster has no spells!");
				return;
			}
			do_mon_spell(spell_index, mon, seen);

			/* Remember what the monster did */
			if (seen) {
				rsf_on(lore->spell_flags, spell_index);
				if (mon_spell_is_innate(spell_index)) {
					/* Innate spell */
					if (lore->cast_innate < UCHAR_MAX)
						lore->cast_innate++;
				} else {
					/* Bolt or Ball, or Special spell */
					if (lore->cast_spell < UCHAR_MAX)
						lore->cast_spell++;
				}
			}
			if (player->is_dead && (lore->deaths < SHRT_MAX)) {
				lore->deaths++;
			}
			lore_update(mon->race, lore);

			break;
		}
		case CMD_DROP: {
			char o_name[80];
			struct object *obj = get_random_monster_object(mon);
			if (!obj) break;
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			drop_near(cave, &obj, 0, mon->grid, true, false);
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
			if (!ignore_item_ok(player, obj)) {
				msg("%s drops %s.", m_name, o_name);
			}

			break;
		}
		case CMD_HOLD: {
			/* Do nothing */
			break;
		}
		case CMD_WALK: {
			int dir;
			struct loc grid;
			bool can_move = false;
			bool has_hit = false;
			struct monster *t_mon = NULL;

			/* Get arguments */
			if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
				return;
			grid = loc_sum(mon->grid, ddgrid[dir]);

			/* Don't let immobile monsters be moved */
			if (rf_has(mon->race->flags, RF_NEVER_MOVE)) {
				msg("The monster can not move.");
				return;
			}

			/* Monster there - attack */
			t_mon = square_monster(cave, grid);
			if (t_mon) {
				/* Attack the monster */
				if (monster_attack_monster(mon, t_mon)) {
					has_hit = true;
				} else {
					can_move = false;
				}
			} else if (square_ispassable(cave, grid)) {
				/* Floor is open? */
				can_move = true;
			} else if (square_isperm(cave, grid)) {
				/* Permanent wall in the way */
				can_move = false;
			} else {
				/* There's some kind of feature in the way, so learn about
				 * kill-wall and pass-wall now */
				if (monster_is_visible(mon)) {
					rf_on(lore->flags, RF_PASS_WALL);
					rf_on(lore->flags, RF_KILL_WALL);
					rf_on(lore->flags, RF_SMASH_WALL);
				}

				/* Monster may be able to deal with walls and doors */
				if (rf_has(mon->race->flags, RF_PASS_WALL)) {
					can_move = true;
				} else if (rf_has(mon->race->flags, RF_KILL_WALL)) {
					/* Remove the wall */
					square_destroy_wall(cave, grid);
					can_move = true;
				} else if (rf_has(mon->race->flags, RF_SMASH_WALL)) {
					/* Remove everything */
					square_smash_wall(cave, grid);
					can_move = true;
				} else if (square_iscloseddoor(cave, grid) ||
						   square_issecretdoor(cave, grid)) {
					bool can_open = rf_has(mon->race->flags, RF_OPEN_DOOR);
					bool can_bash = rf_has(mon->race->flags, RF_BASH_DOOR);

					/* Learn about door abilities */
					if (monster_is_visible(mon)) {
						rf_on(lore->flags, RF_OPEN_DOOR);
						rf_on(lore->flags, RF_BASH_DOOR);
					}

					/* If the monster can deal with doors, prefer to bash */
					if (can_bash || can_open) {
						/* Now outcome depends on type of door */
						if (square_islockeddoor(cave, grid)) {
							/* Test strength against door strength */
							int k = square_door_power(cave, grid);
							if (randint0(mon->hp / 10) > k) {
								if (can_bash) {
									msg("%s slams against the door.", m_name);
								} else {
									msg("%s fiddles with the lock.", m_name);
								}

								/* Reduce the power of the door by one */
								square_set_door_lock(cave, grid, k - 1);
							}
						} else {
							/* Closed or secret door -- always open or bash */
							if (can_bash) {
								square_smash_door(cave, grid);

								msg("You hear a door burst open!");

								/* Fall into doorway */
								can_move = true;
							} else {
								square_open_door(cave, grid);
								can_move = true;
							}
						}
					}
				}
			}

			if (has_hit) {
				break;
			} else if (can_move) {
				monster_swap(mon->grid, grid);
				player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
			} else {
				msg("The way is blocked.");
			}
			break;
		}
		default: {
			msg("Valid commands: move, stand still, 'd'rop, 'm'agic, or 'r'elease.");
			return;
		}
	}


	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;
}